

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

void __thiscall Automaton::buildLookaheads(Automaton *this)

{
  QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
  *this_00;
  _List_node_base **pp_Var1;
  QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
  *pQVar2;
  _Base_ptr p_Var3;
  _Rb_tree_const_iterator<std::_List_iterator<QString>_> __first;
  _List_node_base *p_Var4;
  _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
  *this_01;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *psVar5;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<Item>,_Lookback>_> _Var6;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *__x;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *this_02;
  const_iterator it;
  _List_node_base *p_Var7;
  _Base_ptr *this_03;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>
  pVar8;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<Item>,_Lookback>_> local_50;
  _List_iterator<Item> local_48;
  key_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var7 = (this->states).super__List_base<State,_std::allocator<State>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)&this->states) {
    this_00 = &this->lookaheads;
    do {
      pp_Var1 = &p_Var7[2]._M_prev;
      local_40._M_node = p_Var7[2]._M_prev;
      if (local_40._M_node != (_List_node_base *)pp_Var1) {
        do {
          pQVar2 = (this->lookbacks).d.d.ptr;
          if ((pQVar2 != (QMapData<std::multimap<std::_List_iterator<Item>,_Lookback,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>_>
                          *)0x0) &&
             (pVar8 = std::
                      _Rb_tree<std::_List_iterator<Item>,_std::pair<const_std::_List_iterator<Item>,_Lookback>,_std::_Select1st<std::pair<const_std::_List_iterator<Item>,_Lookback>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_Lookback>_>_>
                      ::equal_range(&(pQVar2->m)._M_t,&local_40),
             pVar8.first._M_node._M_node != pVar8.second._M_node._M_node)) {
            do {
              local_50 = pVar8.second._M_node;
              _Var6 = pVar8.first._M_node;
              p_Var3 = _Var6._M_node[1]._M_parent;
              this_01 = (_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
                         *)QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                           ::operator[](this_00,&local_40);
              this_03 = &p_Var3[2]._M_left;
              psVar5 = QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                       ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                                     *)this_03,(_List_iterator<QString> *)&_Var6._M_node[1]._M_left)
              ;
              __first._M_node = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              psVar5 = QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                       ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                                     *)this_03,(_List_iterator<QString> *)&_Var6._M_node[1]._M_left)
              ;
              std::
              _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
              ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::_List_iterator<QString>>>
                        (this_01,__first,
                         (_Rb_tree_const_iterator<std::_List_iterator<QString>_>)
                         &(psVar5->_M_t)._M_impl.super__Rb_tree_header);
              _Var6._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var6._M_node);
              pVar8.second._M_node = local_50._M_node;
              pVar8.first._M_node = _Var6._M_node;
            } while (_Var6._M_node != local_50._M_node);
          }
          local_40._M_node = (local_40._M_node)->_M_next;
        } while (local_40._M_node != (_List_node_base *)pp_Var1);
        local_40._M_node = *pp_Var1;
      }
      p_Var4 = p_Var7[1]._M_next;
      local_48._M_node = local_40._M_node;
      while (local_40._M_node = p_Var4, local_40._M_node != p_Var7 + 1) {
        __x = &QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
               ::operator[](this_00,&local_48)->_M_t;
        this_02 = &QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                   ::operator[](this_00,&local_40)->_M_t;
        std::
        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::operator=(this_02,__x);
        local_48._M_node = (local_48._M_node)->_M_next;
        p_Var4 = (local_40._M_node)->_M_next;
      }
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)&this->states);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildLookaheads ()
{
  for (StatePointer p = states.begin (); p != states.end (); ++p)
    {
      for (ItemPointer item = p->closure.begin (); item != p->closure.end (); ++item)
        {
          const auto range = std::as_const(lookbacks).equal_range(item);
          for (auto it = range.first; it != range.second; ++it)
            {
              const Lookback &lookback = *it;
              StatePointer q = lookback.state;

#ifndef QLALR_NO_DEBUG_LOOKAHEADS
              qerr() << "(" << id (p) << ", " << *item->rule << ") lookbacks ";
              dump (qerr(), lookback);
              qerr() << " with follows (" << id (q) << ", " << lookback.nt << ") = " << q->follows [lookback.nt] << Qt::endl;
#endif

              lookaheads [item].insert (q->follows [lookback.nt].begin (), q->follows [lookback.nt].end ());
            }
        }

      // propagate the lookahead in the kernel
      ItemPointer k = p->kernel.begin ();
      ItemPointer c = p->closure.begin ();

      for (; k != p->kernel.end (); ++k, ++c)
        lookaheads [k] = lookaheads [c];
    }
}